

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefAs(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,RefAsOp op)

{
  RefAs *pRVar1;
  bool bVar2;
  Ok local_a5;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  Result<wasm::Ok> _val;
  RefAs curr;
  RefAsOp op_local;
  IRBuilder *this_local;
  
  pRVar1 = (RefAs *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  RefAs::RefAs(pRVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitRefAs
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_70 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_a4 == 0) {
    pRVar1 = Builder::makeRefAs(&this->builder,op,(Expression *)curr._16_8_);
    push(this,(Expression *)pRVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefAs(RefAsOp op) {
  RefAs curr;
  curr.op = op;
  CHECK_ERR(visitRefAs(&curr));
  push(builder.makeRefAs(op, curr.value));
  return Ok{};
}